

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(void)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  string *s;
  int algo;
  stack<State,_std::deque<State,_std::allocator<State>_>_> agenda;
  string in;
  State end;
  State start;
  set<State,_std::less<State>,_std::allocator<State>_> closedSet;
  int local_14c;
  undefined1 local_148 [24];
  _Elt_pointer pSStack_130;
  State *local_128;
  _Map_pointer ppSStack_120;
  _Elt_pointer local_118;
  _Elt_pointer pSStack_110;
  _Elt_pointer local_108;
  _Map_pointer ppSStack_100;
  char *local_f0;
  undefined8 local_e8;
  char local_e0;
  undefined7 uStack_df;
  State local_d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a8;
  State local_90;
  _Rb_tree<State,_State,_std::_Identity<State>,_std::less<State>,_std::allocator<State>_> local_68;
  
  local_f0 = &local_e0;
  local_e8 = 0;
  local_e0 = '\0';
  State::State(&local_90);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Do you want to generate a random configuration? (Y/n)",0x35);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
  std::ostream::put(-0x18);
  poVar3 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,"If not, the project\'s default one will be used: ",0x30);
  std::operator>>((istream *)&std::cin,(string *)&local_f0);
  iVar2 = tolower((int)*local_f0);
  if (iVar2 != 0x6e) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Insert width: ",0xe);
    std::istream::operator>>((istream *)&std::cin,(int *)&local_68);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Insert height: ",0xf);
    std::istream::operator>>((istream *)&std::cin,(int *)&local_d0);
    do {
      State::State((State *)local_148,local_68._M_impl._0_4_,(int)local_d0.tiles);
      State::operator=(&local_90,(State *)local_148);
      State::~State((State *)local_148);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
      std::ostream::put(-0x18);
      poVar3 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Start: ",7);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      poVar3 = (ostream *)std::ostream::flush();
      State::toString_abi_cxx11_((string *)local_148,&local_90);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,(char *)local_148._0_8_,local_148._8_8_);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      if ((pointer)local_148._0_8_ != (pointer)(local_148 + 0x10)) {
        operator_delete((void *)local_148._0_8_,(ulong)((long)(int ***)local_148._16_8_ + 1));
      }
      bVar1 = State::isSolvable(&local_90);
      if (bVar1) goto LAB_00102532;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Starting layout is not solvable! Try again? (Y/n)",0x31);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
      std::ostream::put(-0x18);
      std::ostream::flush();
      std::operator>>((istream *)&std::cin,(string *)&local_f0);
      iVar2 = tolower((int)*local_f0);
    } while (iVar2 != 0x6e);
    goto LAB_00102bcb;
  }
  local_68._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x200000003;
  local_68._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x500000008;
  local_68._M_impl._0_8_ = 0x700000006;
  local_68._M_impl.super__Rb_tree_header._M_header._0_8_ = 1;
  local_68._M_impl.super__Rb_tree_header._M_header._M_right =
       (_Base_ptr)CONCAT44(local_68._M_impl.super__Rb_tree_header._M_header._M_right._4_4_,4);
  State::State((State *)local_148,3,3,(int *)&local_68);
  State::operator=(&local_90,(State *)local_148);
  State::~State((State *)local_148);
LAB_00102532:
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Select algorithm (1/2/3): ",0x1a);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
  std::ostream::put(-0x18);
  poVar3 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"1) Depth First Search",0x15);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  poVar3 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"2) Breadth First Search",0x17);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  poVar3 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"3) Best First Search",0x14);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  std::istream::operator>>((istream *)&std::cin,&local_14c);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
  std::ostream::put(-0x18);
  std::ostream::flush();
  std::chrono::_V2::system_clock::now();
  State::State(&local_d0);
  local_68._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_68._M_impl.super__Rb_tree_header._M_header;
  local_68._M_impl.super__Rb_tree_header._M_header._0_8_ =
       local_68._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
  local_68._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_68._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_68._M_impl.super__Rb_tree_header._M_header._M_right =
       local_68._M_impl.super__Rb_tree_header._M_header._M_left;
  if (local_14c == 1) {
    local_108 = (_Elt_pointer)0x0;
    ppSStack_100 = (_Map_pointer)0x0;
    local_118 = (_Elt_pointer)0x0;
    pSStack_110 = (_Elt_pointer)0x0;
    local_128 = (State *)0x0;
    ppSStack_120 = (_Map_pointer)0x0;
    local_148._16_8_ = (_Elt_pointer)0x0;
    pSStack_130 = (_Elt_pointer)0x0;
    local_148._0_8_ = (pointer)0x0;
    local_148._8_4_ = 0;
    local_148._12_4_ = 0;
    std::_Deque_base<State,_std::allocator<State>_>::_M_initialize_map
              ((_Deque_base<State,_std::allocator<State>_> *)local_148,0);
    std::deque<State,_std::allocator<State>_>::push_back
              ((deque<State,_std::allocator<State>_> *)local_148,&local_90);
    iVar2 = search<std::stack<State,std::deque<State,std::allocator<State>>>>
                      (&local_d0,(set<State,_std::less<State>,_std::allocator<State>_> *)&local_68,
                       (stack<State,_std::deque<State,_std::allocator<State>_>_> *)local_148);
LAB_0010292f:
    std::deque<State,_std::allocator<State>_>::~deque
              ((deque<State,_std::allocator<State>_> *)local_148);
  }
  else {
    if (local_14c == 2) {
      local_108 = (_Elt_pointer)0x0;
      ppSStack_100 = (_Map_pointer)0x0;
      local_118 = (_Elt_pointer)0x0;
      pSStack_110 = (_Elt_pointer)0x0;
      local_128 = (State *)0x0;
      ppSStack_120 = (_Map_pointer)0x0;
      local_148._16_8_ = (_Elt_pointer)0x0;
      pSStack_130 = (_Elt_pointer)0x0;
      local_148._0_8_ = (pointer)0x0;
      local_148._8_4_ = 0;
      local_148._12_4_ = 0;
      std::_Deque_base<State,_std::allocator<State>_>::_M_initialize_map
                ((_Deque_base<State,_std::allocator<State>_> *)local_148,0);
      std::deque<State,_std::allocator<State>_>::push_back
                ((deque<State,_std::allocator<State>_> *)local_148,&local_90);
      iVar2 = search<my_queue>(&local_d0,
                               (set<State,_std::less<State>,_std::allocator<State>_> *)&local_68,
                               (my_queue *)local_148);
      goto LAB_0010292f;
    }
    local_148._0_8_ = (pointer)0x0;
    local_148._8_4_ = 0;
    local_148._12_4_ = 0;
    local_148._16_8_ = (_Elt_pointer)0x0;
    std::priority_queue<State,_std::vector<State,_std::allocator<State>_>,_compareStates>::push
              ((priority_queue<State,_std::vector<State,_std::allocator<State>_>,_compareStates> *)
               local_148,&local_90);
    iVar2 = search<my_priority_queue>
                      (&local_d0,(set<State,_std::less<State>,_std::allocator<State>_> *)&local_68,
                       (my_priority_queue *)local_148);
    std::vector<State,_std::allocator<State>_>::~vector
              ((vector<State,_std::allocator<State>_> *)local_148);
  }
  if (iVar2 < 1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"No solution!",0xc);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
    std::ostream::put(-0x18);
    std::ostream::flush();
  }
  else {
    std::chrono::_V2::system_clock::now();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Solution:",9);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
    std::ostream::put(-0x18);
    std::ostream::flush();
    State::getPath_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_148,&local_d0);
    State::getPath_abi_cxx11_(&local_a8,&local_d0);
    for (; local_a8.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start !=
           local_a8.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
        local_a8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             local_a8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 1) {
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,
                          ((local_a8.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p,
                          (local_a8.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Completed in ",0xd);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," steps.",7);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    poVar3 = (ostream *)std::ostream::flush();
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," iterations / ",0xe);
    poVar3 = std::ostream::_M_insert<long>((long)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"ms",2);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_148);
  }
  std::_Rb_tree<State,_State,_std::_Identity<State>,_std::less<State>,_std::allocator<State>_>::
  ~_Rb_tree(&local_68);
  State::~State(&local_d0);
LAB_00102bcb:
  State::~State(&local_90);
  if (local_f0 != &local_e0) {
    operator_delete(local_f0,CONCAT71(uStack_df,local_e0) + 1);
  }
  return 0;
}

Assistant:

int main() {
    std::string in;
    State start;

    std::cout << "Do you want to generate a random configuration? (Y/n)" << std::endl
              << "If not, the project's default one will be used: ";
    std::cin >> in;

    if (std::tolower(in[0]) == 'n') {
        int numbers[] = {6, 7, 1, 0, 3, 2, 8, 5, 4};
        start = State(3, 3, numbers);
    } else {
        int width, height;
        std::cout << "Insert width: ";
        std::cin >> width;
        std::cout << "Insert height: ";
        std::cin >> height;

        bool ok = false;
        while (!ok) {
            start = State(width, height);
            std::cout << std::endl
                      << "Start: " << std::endl
                      << start.toString() << std::endl;

            ok = start.isSolvable();

            if (!ok) {
                std::cout << "Starting layout is not solvable! Try again? (Y/n)" << std::endl;
                std::cin >> in;

                if (std::tolower(in[0]) == 'n')
                    return 0;
            }
        }
    }

    int algo;
    std::cout << "Select algorithm (1/2/3): " << std::endl
              << "1) Depth First Search" << std::endl
              << "2) Breadth First Search" << std::endl
              << "3) Best First Search" << std::endl;
    std::cin >> algo;
    std::cout << std::endl;

    int iterations;
    auto time0 = std::chrono::high_resolution_clock::now();

    State end;
    std::set<State> closedSet;

    switch (algo) {
        case 1: {
            std::stack<State> agenda;
            agenda.push(start);
            iterations = dfs(end, closedSet, agenda);
            break;
        }

        case 2: {
            my_queue agenda;
            agenda.push(start);
            iterations = bfs(end, closedSet, agenda);
            break;
        }

        default: {
            my_priority_queue agenda;
            agenda.push(start);
            iterations = bestfs(end, closedSet, agenda);
            break;
        }
    }

    if (iterations > 0) {
        auto time1 = std::chrono::high_resolution_clock::now();
        auto ms = std::chrono::duration_cast<std::chrono::milliseconds>(time1 - time0).count();

        std::cout << "Solution:" << std::endl;
        std::vector<std::string> path = end.getPath();
        for (std::string &s : end.getPath()) {
            std::cout << s << std::endl;
        }

        std::cout << "Completed in " << path.size() - 1 << " steps." << std::endl
                  << iterations << " iterations / " << ms << "ms" << std::endl;
    } else {
        std::cout << "No solution!" << std::endl;
    }

    return 0;
}